

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVector<ImGuiGroupData> *this;
  undefined4 uVar1;
  ImVec2 IVar2;
  undefined4 text_offset_y;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  value_type *pvVar5;
  ImGuiContext *g;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  ImRect local_68;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  ImVec2 local_28;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if ((pIVar3->DC).GroupStack.Size != 0) {
    this = &(pIVar3->DC).GroupStack;
    pvVar5 = ImVector<ImGuiGroupData>::back(this);
    local_68.Min = pvVar5->BackupCursorPos;
    IVar2 = (pIVar3->DC).CursorMaxPos;
    fVar8 = IVar2.x;
    fVar9 = IVar2.y;
    local_38 = local_68.Min.y;
    uVar6 = -(uint)(fVar8 <= local_68.Min.x);
    uVar7 = -(uint)(fVar9 <= local_38);
    uStack_40 = 0;
    local_68.Max = (ImVec2)(CONCAT44(~uVar7 & (uint)fVar9,~uVar6 & (uint)fVar8) |
                           CONCAT44((uint)local_38 & uVar7,(uint)local_68.Min.x & uVar6));
    uStack_50 = 0;
    (pIVar3->DC).CursorPos = local_68.Min;
    local_58 = local_68.Max;
    local_48 = local_68.Min;
    fStack_34 = local_38;
    fStack_30 = local_38;
    fStack_2c = local_38;
    IVar2 = ImMax(&pvVar5->BackupCursorMaxPos,&(pIVar3->DC).CursorMaxPos);
    (pIVar3->DC).CursorMaxPos = IVar2;
    uVar1 = pvVar5->BackupCurrentLineHeight;
    text_offset_y = pvVar5->BackupCurrentLineTextBaseOffset;
    (pIVar3->DC).CurrentLineHeight = (float)uVar1;
    (pIVar3->DC).CurrentLineTextBaseOffset = (float)text_offset_y;
    fVar8 = pvVar5->BackupGroupOffsetX;
    (pIVar3->DC).IndentX = pvVar5->BackupIndentX;
    (pIVar3->DC).GroupOffsetX = fVar8;
    (pIVar3->DC).LogLinePosY = local_38 + -9999.0;
    if (pvVar5->AdvanceCursor == true) {
      fVar8 = (pIVar3->DC).PrevLineTextBaseOffset;
      uVar6 = -(uint)((float)text_offset_y <= fVar8);
      (pIVar3->DC).CurrentLineTextBaseOffset = (float)(~uVar6 & text_offset_y | (uint)fVar8 & uVar6)
      ;
      local_28.x = local_58.x - local_48.x;
      local_28.y = local_58.y - local_48.y;
      ItemSize(&local_28,(float)text_offset_y);
      ItemAdd(&local_68,0,(ImRect *)0x0);
    }
    if ((((pvVar5->BackupActiveIdIsAlive == false) && (pIVar4->ActiveIdIsAlive == true)) &&
        (pIVar4->ActiveId != 0)) && (pIVar4->ActiveIdWindow->RootWindow == pIVar3->RootWindow)) {
      (pIVar3->DC).LastItemId = pIVar4->ActiveId;
    }
    (pIVar3->DC).LastItemRect.Min = local_68.Min;
    (pIVar3->DC).LastItemRect.Max = local_68.Max;
    ImVector<ImGuiGroupData>::pop_back(this);
    return;
  }
  __assert_fail("!window->DC.GroupStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x3157,"void ImGui::EndGroup()");
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(!window->DC.GroupStack.empty());    // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, window->DC.CursorMaxPos);
    group_bb.Max = ImMax(group_bb.Min, group_bb.Max);

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.CurrentLineHeight = group_data.BackupCurrentLineHeight;
    window->DC.CurrentLineTextBaseOffset = group_data.BackupCurrentLineTextBaseOffset;
    window->DC.IndentX = group_data.BackupIndentX;
    window->DC.GroupOffsetX = group_data.BackupGroupOffsetX;
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f;

    if (group_data.AdvanceCursor)
    {
        window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrentLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
        ItemSize(group_bb.GetSize(), group_data.BackupCurrentLineTextBaseOffset);
        ItemAdd(group_bb, 0);
    }

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive() will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but if you search for LastItemId you'll notice it is only used in that context.
    const bool active_id_within_group = (!group_data.BackupActiveIdIsAlive && g.ActiveIdIsAlive && g.ActiveId && g.ActiveIdWindow->RootWindow == window->RootWindow);
    if (active_id_within_group)
        window->DC.LastItemId = g.ActiveId;
    window->DC.LastItemRect = group_bb;

    window->DC.GroupStack.pop_back();

    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}